

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int vdbeMergeEngineInit(SortSubtask *pTask,MergeEngine *pMerger,int eMode)

{
  int iVar1;
  int local_2c;
  int nTree;
  int i;
  int rc;
  int eMode_local;
  MergeEngine *pMerger_local;
  SortSubtask *pTask_local;
  
  iVar1 = pMerger->nTree;
  pMerger->pTask = pTask;
  local_2c = 0;
  while( true ) {
    if (iVar1 <= local_2c) {
      local_2c = pMerger->nTree;
      while (local_2c = local_2c + -1, 0 < local_2c) {
        vdbeMergeEngineCompare(pMerger,local_2c);
      }
      return (uint)pTask->pUnpacked->errCode;
    }
    if (eMode == 2) {
      nTree = vdbePmaReaderNext(pMerger->aReadr + ((iVar1 - local_2c) + -1));
    }
    else {
      nTree = vdbePmaReaderIncrInit(pMerger->aReadr + local_2c,0);
    }
    if (nTree != 0) break;
    local_2c = local_2c + 1;
  }
  return nTree;
}

Assistant:

static int vdbeMergeEngineInit(
  SortSubtask *pTask,             /* Thread that will run pMerger */
  MergeEngine *pMerger,           /* MergeEngine to initialize */
  int eMode                       /* One of the INCRINIT_XXX constants */
){
  int rc = SQLITE_OK;             /* Return code */
  int i;                          /* For looping over PmaReader objects */
  int nTree = pMerger->nTree;

  /* eMode is always INCRINIT_NORMAL in single-threaded mode */
  assert( SQLITE_MAX_WORKER_THREADS>0 || eMode==INCRINIT_NORMAL );

  /* Verify that the MergeEngine is assigned to a single thread */
  assert( pMerger->pTask==0 );
  pMerger->pTask = pTask;

  for(i=0; i<nTree; i++){
    if( SQLITE_MAX_WORKER_THREADS>0 && eMode==INCRINIT_ROOT ){
      /* PmaReaders should be normally initialized in order, as if they are
      ** reading from the same temp file this makes for more linear file IO.
      ** However, in the INCRINIT_ROOT case, if PmaReader aReadr[nTask-1] is
      ** in use it will block the vdbePmaReaderNext() call while it uses
      ** the main thread to fill its buffer. So calling PmaReaderNext()
      ** on this PmaReader before any of the multi-threaded PmaReaders takes
      ** better advantage of multi-processor hardware. */
      rc = vdbePmaReaderNext(&pMerger->aReadr[nTree-i-1]);
    }else{
      rc = vdbePmaReaderIncrInit(&pMerger->aReadr[i], INCRINIT_NORMAL);
    }
    if( rc!=SQLITE_OK ) return rc;
  }

  for(i=pMerger->nTree-1; i>0; i--){
    vdbeMergeEngineCompare(pMerger, i);
  }
  return pTask->pUnpacked->errCode;
}